

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void VP8YuvToBgra32_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  uint8_t *puVar1;
  char cVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [12];
  unkbyte10 Var5;
  unkbyte9 Var6;
  undefined6 uVar7;
  undefined4 uVar8;
  undefined2 uVar9;
  ulong uVar10;
  undefined2 uVar11;
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  __m128i B;
  __m128i G;
  __m128i R;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  undefined4 uVar12;
  undefined6 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [14];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  for (uVar10 = 0; uVar10 < 0x20; uVar10 = uVar10 + 8) {
    YUV444ToRGB_SSE2(y + uVar10,u + uVar10,v + uVar10,(__m128i *)&local_48,(__m128i *)&local_58,
                     (__m128i *)&local_68);
    cVar2 = (0 < sStack_5a) * (sStack_5a < 0x100) * (char)sStack_5a - (0xff < sStack_5a);
    uVar9 = CONCAT11((0 < sStack_4a) * (sStack_4a < 0x100) * (char)sStack_4a - (0xff < sStack_4a),
                     cVar2);
    uVar8 = CONCAT31(CONCAT21(uVar9,(0 < sStack_4c) * (sStack_4c < 0x100) * (char)sStack_4c -
                                    (0xff < sStack_4c)),
                     (0 < sStack_5c) * (sStack_5c < 0x100) * (char)sStack_5c - (0xff < sStack_5c));
    uVar7 = CONCAT51(CONCAT41(uVar8,(0 < sStack_4e) * (sStack_4e < 0x100) * (char)sStack_4e -
                                    (0xff < sStack_4e)),
                     (0 < sStack_5e) * (sStack_5e < 0x100) * (char)sStack_5e - (0xff < sStack_5e));
    Var6 = CONCAT72(CONCAT61(uVar7,(0 < sStack_50) * (sStack_50 < 0x100) * (char)sStack_50 -
                                   (0xff < sStack_50)),
                    CONCAT11((0 < sStack_60) * (sStack_60 < 0x100) * (char)sStack_60 -
                             (0xff < sStack_60),cVar2));
    Var5 = CONCAT91(CONCAT81((long)((unkuint9)Var6 >> 8),
                             (0 < sStack_52) * (sStack_52 < 0x100) * (char)sStack_52 -
                             (0xff < sStack_52)),
                    (0 < sStack_62) * (sStack_62 < 0x100) * (char)sStack_62 - (0xff < sStack_62));
    auVar4._2_10_ = Var5;
    auVar4[1] = (0 < sStack_54) * (sStack_54 < 0x100) * (char)sStack_54 - (0xff < sStack_54);
    auVar4[0] = (0 < sStack_64) * (sStack_64 < 0x100) * (char)sStack_64 - (0xff < sStack_64);
    auVar3._2_12_ = auVar4;
    auVar3[1] = (0 < sStack_56) * (sStack_56 < 0x100) * (char)sStack_56 - (0xff < sStack_56);
    auVar3[0] = (0 < sStack_66) * (sStack_66 < 0x100) * (char)sStack_66 - (0xff < sStack_66);
    auVar22._0_2_ =
         CONCAT11((0 < local_58) * (local_58 < 0x100) * (char)local_58 - (0xff < local_58),
                  (0 < local_68) * (local_68 < 0x100) * (char)local_68 - (0xff < local_68));
    auVar22._2_14_ = auVar3;
    uVar11 = CONCAT11(0xff,(0 < local_48) * (local_48 < 0x100) * (char)local_48 - (0xff < local_48))
    ;
    uVar12 = CONCAT13(0xff,CONCAT12((0 < sStack_46) * (sStack_46 < 0x100) * (char)sStack_46 -
                                    (0xff < sStack_46),uVar11));
    uVar13 = CONCAT15(0xff,CONCAT14((0 < sStack_44) * (sStack_44 < 0x100) * (char)sStack_44 -
                                    (0xff < sStack_44),uVar12));
    uVar14 = CONCAT17(0xff,CONCAT16((0 < sStack_42) * (sStack_42 < 0x100) * (char)sStack_42 -
                                    (0xff < sStack_42),uVar13));
    auVar15._0_10_ =
         CONCAT19(0xff,CONCAT18((0 < sStack_40) * (sStack_40 < 0x100) * (char)sStack_40 -
                                (0xff < sStack_40),uVar14));
    auVar15[10] = (0 < sStack_3e) * (sStack_3e < 0x100) * (char)sStack_3e - (0xff < sStack_3e);
    auVar15[0xb] = 0xff;
    auVar16[0xc] = (0 < sStack_3c) * (sStack_3c < 0x100) * (char)sStack_3c - (0xff < sStack_3c);
    auVar16._0_12_ = auVar15;
    auVar16[0xd] = 0xff;
    auVar17[0xe] = (0 < sStack_3a) * (sStack_3a < 0x100) * (char)sStack_3a - (0xff < sStack_3a);
    auVar17._0_14_ = auVar16;
    auVar17[0xf] = 0xff;
    auVar21._0_12_ = auVar22._0_12_;
    auVar21._12_2_ = (short)Var5;
    auVar21._14_2_ = (short)((ulong)uVar14 >> 0x30);
    auVar20._12_4_ = auVar21._12_4_;
    auVar20._0_10_ = auVar22._0_10_;
    auVar20._10_2_ = (short)((uint6)uVar13 >> 0x20);
    auVar19._10_6_ = auVar20._10_6_;
    auVar19._0_8_ = auVar22._0_8_;
    auVar19._8_2_ = auVar4._0_2_;
    auVar18._8_8_ = auVar19._8_8_;
    auVar18._6_2_ = (short)((uint)uVar12 >> 0x10);
    auVar18._4_2_ = auVar3._0_2_;
    auVar18._2_2_ = uVar11;
    auVar18._0_2_ = auVar22._0_2_;
    *(undefined1 (*) [16])(dst + uVar10 * 4) = auVar18;
    puVar1 = dst + uVar10 * 4 + 0x10;
    *(short *)puVar1 = (short)((unkuint9)Var6 >> 8);
    *(short *)(puVar1 + 2) = (short)((unkuint10)auVar15._0_10_ >> 0x40);
    *(short *)(puVar1 + 4) = (short)uVar7;
    *(short *)(puVar1 + 6) = auVar15._10_2_;
    *(short *)(puVar1 + 8) = (short)uVar8;
    *(short *)(puVar1 + 10) = auVar16._12_2_;
    *(undefined2 *)(puVar1 + 0xc) = uVar9;
    *(short *)(puVar1 + 0xe) = auVar17._14_2_;
  }
  return;
}

Assistant:

void VP8YuvToBgra32_SSE2(const uint8_t* y, const uint8_t* u, const uint8_t* v,
                         uint8_t* dst) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n < 32; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore4_SSE2(&B, &G, &R, &kAlpha, dst);
  }
}